

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O3

vector<LongReadMapping,_std::allocator<LongReadMapping>_> * __thiscall
LongReadsMapper::filter_and_chain_matches_by_offset_group
          (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__return_storage_ptr__,
          LongReadsMapper *this,vector<LongReadMapping,_std::allocator<LongReadMapping>_> *matches,
          bool verbose)

{
  int iVar1;
  int iVar2;
  LongReadMapping *pLVar3;
  pointer pLVar4;
  long lVar5;
  iterator __position;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  undefined3 uVar11;
  int32_t iVar12;
  undefined3 uVar13;
  int32_t iVar14;
  iterator iVar15;
  _Bit_iterator_base _Var16;
  vector<LongReadMapping,std::allocator<LongReadMapping>> *this_00;
  match_band *m_1;
  ostream *poVar17;
  long *plVar18;
  int32_t *piVar19;
  pointer pmVar20;
  pointer pLVar21;
  undefined7 in_register_00000009;
  ulong uVar22;
  _Bit_type *p_Var23;
  _Bit_type *p_Var24;
  match_band *mb;
  int iVar25;
  int iVar26;
  char *pcVar27;
  ulong uVar28;
  pointer pmVar29;
  ulong uVar30;
  __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_> __i;
  pointer pmVar31;
  long lVar32;
  match_band *m_2;
  ulong uVar33;
  undefined1 auVar34 [8];
  LongReadMapping *m;
  LongReadMapping *pLVar35;
  int iVar36;
  vector<match_band,_std::allocator<match_band>_> filtered_mbo;
  vector<match_band,_std::allocator<match_band>_> mbo;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *filtered_matches;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range2;
  bool local_dd;
  int local_dc;
  undefined1 local_d8 [8];
  iterator iStack_d0;
  match_band *local_c8;
  vector<match_band,_std::allocator<match_band>_> local_b8;
  match_band local_98;
  undefined1 local_78 [24];
  int iStack_60;
  int iStack_5c;
  _Bit_pointer local_58;
  vector<LongReadMapping,std::allocator<LongReadMapping>> *local_48;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_40;
  float local_34;
  
  local_dc = (int)CONCAT71(in_register_00000009,verbose);
  local_48 = (vector<LongReadMapping,std::allocator<LongReadMapping>> *)__return_storage_ptr__;
  local_40 = matches;
  if (local_dc != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Filtering matches:",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    pLVar3 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pLVar35 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)
                   ._M_impl.super__Vector_impl_data._M_start; pLVar35 != pLVar3;
        pLVar35 = pLVar35 + 1) {
      poVar17 = ::operator<<((ostream *)&std::cout,pLVar35);
      std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
    }
  }
  local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar21 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pLVar4 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  lVar5 = pLVar21->node;
  lVar32 = -lVar5;
  if (0 < lVar5) {
    lVar32 = lVar5;
  }
  if (pLVar21 != pLVar4) {
    do {
      local_dd = lVar32 == pLVar21->node;
      local_78._0_4_ = pLVar21->qStart - pLVar21->nStart;
      local_d8._0_4_ = pLVar21->qEnd - pLVar21->nEnd;
      local_98._0_4_ = pLVar21->nEnd - pLVar21->nStart;
      std::vector<match_band,std::allocator<match_band>>::emplace_back<bool,int,int,int,int_const&>
                ((vector<match_band,std::allocator<match_band>> *)&local_b8,&local_dd,
                 (int *)local_78,(int *)local_d8,(int *)&local_98,&pLVar21->score);
      pLVar21 = pLVar21 + 1;
    } while (pLVar21 != pLVar4);
    for (pmVar20 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pmVar20 !=
        local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
        super__Vector_impl_data._M_finish; pmVar20 = pmVar20 + 1) {
      iVar36 = pmVar20->min_offset;
      iVar25 = pmVar20->max_offset;
      iVar26 = iVar36;
      if (iVar25 < iVar36) {
        iVar26 = iVar25;
      }
      if (iVar25 < iVar36) {
        iVar25 = iVar36;
      }
      pmVar20->min_offset = iVar26 + -200;
      pmVar20->max_offset = iVar25 + 200;
    }
  }
  if ((char)local_dc != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Orientations, offsets, lengths and scores:",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pmVar20 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                   super__Vector_impl_data._M_start; pmVar20 != pmVar29; pmVar20 = pmVar20 + 1) {
      pcVar27 = "false";
      if ((ulong)pmVar20->dir != 0) {
        pcVar27 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar27,(ulong)pmVar20->dir ^ 5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      poVar17 = (ostream *)std::ostream::operator<<(&std::cout,pmVar20->min_offset);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,pmVar20->max_offset);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,pmVar20->len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
      plVar18 = (long *)std::ostream::operator<<(poVar17,pmVar20->score);
      std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
      std::ostream::put((char)plVar18);
      std::ostream::flush();
    }
  }
  if ((long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
            super__Vector_impl_data._M_start == -0x14) {
    uVar28 = 0xffffffffffffffff;
    bVar6 = false;
    pmVar20 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_start;
    pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    uVar28 = ((long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
    do {
      auVar9[0xf] = 0;
      auVar9._0_15_ = stack0xffffffffffffff29;
      _local_d8 = auVar9 << 8;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_78,uVar28,(bool *)local_d8,
                 (allocator_type *)&local_98);
      uVar33 = ((long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
      _local_d8 = (undefined1  [16])0x0;
      local_c8 = (match_band *)0x0;
      if (local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar28 = 0;
        pmVar20 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          uVar22 = uVar28 >> 6 & 0x3ffffff;
          if ((*(ulong *)(local_78._0_8_ + uVar22 * 8) >> (uVar28 & 0x3f) & 1) == 0) {
            *(ulong *)(local_78._0_8_ + uVar22 * 8) =
                 *(ulong *)(local_78._0_8_ + uVar22 * 8) | 1L << ((byte)uVar28 & 0x3f);
            pmVar29 = pmVar20 + uVar28;
            uVar7._0_1_ = pmVar29->dir;
            uVar7._1_3_ = *(undefined3 *)&pmVar29->field_0x1;
            uVar7._4_4_ = pmVar29->min_offset;
            uVar8._0_4_ = pmVar29->max_offset;
            uVar8._4_4_ = pmVar29->len;
            iVar36 = pmVar20[uVar28].score;
            piVar19 = &pmVar20->len;
            uVar22 = 0;
            local_98._0_8_ = uVar7;
            local_98._8_8_ = uVar8;
            local_98.score = iVar36;
            do {
              uVar30 = uVar22 >> 6 & 0x3ffffff;
              if ((((*(ulong *)(local_78._0_8_ + uVar30 * 8) >> (uVar22 & 0x3f) & 1) == 0) &&
                  (iVar25 = piVar19[-1], uVar7._4_4_ < iVar25)) &&
                 (iVar26 = piVar19[-2], iVar26 < (int32_t)uVar8)) {
                if (iVar26 < uVar7._4_4_) {
                  uVar7._4_4_ = iVar26;
                }
                if ((int32_t)uVar8 <= iVar25) {
                  uVar8._0_4_ = iVar25;
                }
                local_98.min_offset = uVar7._4_4_;
                uVar8._4_4_ = uVar8._4_4_ + (int)*(undefined8 *)piVar19;
                iVar36 = iVar36 + (int)((ulong)*(undefined8 *)piVar19 >> 0x20);
                local_98.len = uVar8._4_4_;
                local_98.max_offset = (int32_t)uVar8;
                *(ulong *)(local_78._0_8_ + uVar30 * 8) =
                     *(ulong *)(local_78._0_8_ + uVar30 * 8) | 1L << ((byte)uVar22 & 0x3f);
                local_98.score = iVar36;
              }
              uVar22 = uVar22 + 1;
              piVar19 = piVar19 + 5;
            } while (uVar33 + (uVar33 == 0) != uVar22);
            if (iStack_d0._M_current == local_c8) {
              std::vector<match_band,std::allocator<match_band>>::_M_realloc_insert<match_band&>
                        ((vector<match_band,std::allocator<match_band>> *)local_d8,iStack_d0,
                         &local_98);
            }
            else {
              (iStack_d0._M_current)->score = local_98.score;
              (iStack_d0._M_current)->dir = local_98.dir;
              *(undefined3 *)&(iStack_d0._M_current)->field_0x1 = local_98._1_3_;
              (iStack_d0._M_current)->min_offset = local_98.min_offset;
              (iStack_d0._M_current)->max_offset = local_98.max_offset;
              (iStack_d0._M_current)->len = local_98.len;
              iStack_d0._M_current = iStack_d0._M_current + 1;
            }
            pmVar20 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar28 = uVar28 + 1;
          uVar33 = ((long)pmVar29 - (long)pmVar20 >> 2) * -0x3333333333333333;
        } while (uVar28 <= uVar33 && uVar33 - uVar28 != 0);
      }
      std::vector<match_band,_std::allocator<match_band>_>::operator=
                (&local_b8,(vector<match_band,_std::allocator<match_band>_> *)local_d8);
      if (local_d8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
      }
      if ((_Bit_type *)local_78._0_8_ != (_Bit_type *)0x0) {
        operator_delete((void *)local_78._0_8_,(long)local_58 - local_78._0_8_);
      }
      uVar28 = ((long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
    } while (uVar28 < uVar33);
    bVar6 = 0x140 < (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>.
                          _M_impl.super__Vector_impl_data._M_start;
    pmVar20 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_start;
    pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (pmVar20 != pmVar29) {
    lVar5 = 0x3f;
    if (uVar28 != 0) {
      for (; uVar28 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__0>>
              (pmVar20,pmVar29,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if (bVar6) {
      pmVar31 = pmVar20 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,__gnu_cxx::__ops::_Iter_comp_iter<LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__0>>
                (pmVar20,pmVar31);
      for (; pmVar31 != pmVar29; pmVar31 = pmVar31 + 1) {
        bVar6 = pmVar31->dir;
        uVar13 = *(undefined3 *)&pmVar31->field_0x1;
        iVar14 = pmVar31->min_offset;
        uVar7 = *(undefined8 *)&pmVar31->max_offset;
        local_78._0_16_ = pmVar31->dir;
        iVar36 = pmVar31->score;
        iVar25 = pmVar31[-1].score;
        pmVar20 = pmVar31;
        while (iVar25 < iVar36) {
          pmVar20->score = pmVar20[-1].score;
          uVar11 = *(undefined3 *)&pmVar20[-1].field_0x1;
          iVar12 = pmVar20[-1].min_offset;
          uVar8 = *(undefined8 *)&pmVar20[-1].max_offset;
          pmVar20->dir = pmVar20[-1].dir;
          *(undefined3 *)&pmVar20->field_0x1 = uVar11;
          pmVar20->min_offset = iVar12;
          *(undefined8 *)&pmVar20->max_offset = uVar8;
          iVar25 = pmVar20[-2].score;
          pmVar20 = pmVar20 + -1;
        }
        pmVar20->dir = bVar6;
        *(undefined3 *)&pmVar20->field_0x1 = uVar13;
        pmVar20->min_offset = iVar14;
        *(undefined8 *)&pmVar20->max_offset = uVar7;
        pmVar20->score = iVar36;
      }
    }
    else {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,__gnu_cxx::__ops::_Iter_comp_iter<LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__0>>
                (pmVar20,pmVar29);
    }
  }
  if ((char)local_dc != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Consolidated orientations, offsets, lengths and scores:\n",
               0x38);
    pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pmVar20 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                   super__Vector_impl_data._M_start; pmVar20 != pmVar29; pmVar20 = pmVar20 + 1) {
      pcVar27 = "false";
      if ((ulong)pmVar20->dir != 0) {
        pcVar27 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar27,(ulong)pmVar20->dir ^ 5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      poVar17 = (ostream *)std::ostream::operator<<(&std::cout,pmVar20->min_offset);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,pmVar20->max_offset);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,pmVar20->len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
      plVar18 = (long *)std::ostream::operator<<(poVar17,pmVar20->score);
      std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
      std::ostream::put((char)plVar18);
      std::ostream::flush();
    }
  }
  _local_d8 = (undefined1  [16])0x0;
  local_c8 = (match_band *)0x0;
  pmVar20 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_34 = (float)(local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                       super__Vector_impl_data._M_start)->score * 0.5;
    pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (local_34 <= (float)pmVar29->score) {
        if (iStack_d0._M_current == local_c8) {
          std::vector<match_band,std::allocator<match_band>>::_M_realloc_insert<match_band_const&>
                    ((vector<match_band,std::allocator<match_band>> *)local_d8,iStack_d0,pmVar29);
        }
        else {
          (iStack_d0._M_current)->score = pmVar29->score;
          uVar13 = *(undefined3 *)&pmVar29->field_0x1;
          uVar7._4_4_ = pmVar29->min_offset;
          uVar8._0_4_ = pmVar29->max_offset;
          uVar8._4_4_ = pmVar29->len;
          (iStack_d0._M_current)->dir = pmVar29->dir;
          *(undefined3 *)&(iStack_d0._M_current)->field_0x1 = uVar13;
          (iStack_d0._M_current)->min_offset = uVar7._4_4_;
          (iStack_d0._M_current)->max_offset = (int32_t)uVar8;
          (iStack_d0._M_current)->len = uVar8._4_4_;
          iStack_d0._M_current = iStack_d0._M_current + 1;
        }
      }
      pmVar29 = pmVar29 + 1;
    } while (pmVar29 != pmVar20);
  }
  if ((char)local_dc != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Filtered orientations, offsets, lengths and scores:\n",0x34);
    iVar15._M_current = iStack_d0._M_current;
    for (auVar34 = local_d8; auVar34 != (undefined1  [8])iVar15._M_current;
        auVar34 = (undefined1  [8])((long)auVar34 + 0x14)) {
      pcVar27 = "false";
      if ((ulong)*(byte *)auVar34 != 0) {
        pcVar27 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar27,(ulong)*(byte *)auVar34 ^ 5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      poVar17 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)((long)auVar34 + 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,*(int *)((long)auVar34 + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,*(int *)((long)auVar34 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
      plVar18 = (long *)std::ostream::operator<<(poVar17,*(int *)((long)auVar34 + 0x10));
      std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
      std::ostream::put((char)plVar18);
      std::ostream::flush();
    }
  }
  this_00 = local_48;
  *(undefined1 (*) [16])local_48 = (undefined1  [16])0x0;
  *(undefined8 *)(local_48 + 0x10) = 0;
  iVar15._M_current = iStack_d0._M_current;
  if (local_d8 != (undefined1  [8])iStack_d0._M_current) {
    auVar34 = local_d8;
    do {
      stack0xffffffffffffff9c = SUB1612((undefined1  [16])0x0,4);
      local_78._16_4_ = 0x80000000;
      pLVar21 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
                _M_impl.super__Vector_impl_data._M_start;
      auVar10._4_8_ = 0;
      auVar10._0_4_ = pLVar21->read_id;
      local_78._0_12_ = auVar10 << 0x40;
      local_78._12_4_ = 0x7fffffff;
      p_Var23 = (_Bit_type *)pLVar21->node;
      p_Var24 = (_Bit_type *)-(long)p_Var23;
      if (0 < (long)p_Var23) {
        p_Var24 = p_Var23;
      }
      p_Var23 = (_Bit_type *)-(long)p_Var24;
      if (*(char *)auVar34 != '\0') {
        p_Var23 = p_Var24;
      }
      local_78._0_8_ = p_Var23;
      pLVar4 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pLVar21 != pLVar4) {
        iVar26 = 0;
        iVar25 = -0x80000000;
        iVar36 = 0x7fffffff;
        do {
          iVar1 = pLVar21->nStart;
          if (*(int *)((long)auVar34 + 4) <= pLVar21->qStart - iVar1) {
            iVar2 = pLVar21->nEnd;
            if (pLVar21->qEnd - iVar2 <= *(int *)((long)auVar34 + 8)) {
              if (iVar1 < iVar36) {
                local_78._12_4_ = iVar1;
                local_78._20_4_ = pLVar21->qStart;
                iVar36 = iVar1;
              }
              if (iVar25 < iVar2) {
                local_78._16_4_ = iVar2;
                iStack_60 = pLVar21->qEnd;
                iVar25 = iVar2;
              }
              iVar26 = iVar26 + pLVar21->score;
              iStack_5c = iVar26;
            }
          }
          pLVar21 = pLVar21 + 1;
        } while (pLVar21 != pLVar4);
      }
      _Var16 = stack0xffffffffffffff98;
      auVar9 = local_78._0_16_;
      __position._M_current = *(LongReadMapping **)(this_00 + 8);
      if (__position._M_current == *(LongReadMapping **)(this_00 + 0x10)) {
        std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
        _M_realloc_insert<LongReadMapping&>(this_00,__position,(LongReadMapping *)local_78);
      }
      else {
        (__position._M_current)->nEnd = local_78._16_4_;
        (__position._M_current)->qStart = local_78._20_4_;
        (__position._M_current)->qEnd = iStack_60;
        (__position._M_current)->score = iStack_5c;
        (__position._M_current)->node = local_78._0_8_;
        (__position._M_current)->read_id = local_78._8_4_;
        (__position._M_current)->nStart = local_78._12_4_;
        *(LongReadMapping **)(this_00 + 8) = __position._M_current + 1;
        local_78._0_16_ = auVar9;
        unique0x1000140e = _Var16;
      }
      auVar34 = (undefined1  [8])((long)auVar34 + 0x14);
    } while (auVar34 != (undefined1  [8])iVar15._M_current);
  }
  if ((char)local_dc != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Filtered matches:",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    pLVar3 = *(LongReadMapping **)(this_00 + 8);
    for (pLVar35 = *(LongReadMapping **)this_00; pLVar35 != pLVar3; pLVar35 = pLVar35 + 1) {
      poVar17 = ::operator<<((ostream *)&std::cout,pLVar35);
      std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
    }
  }
  if (local_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
  }
  if (local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)this_00;
}

Assistant:

std::vector<LongReadMapping>
LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping> &matches, bool verbose) const {

    const int32_t OFFSET_BANDWITDH=200;
    if (verbose){
        std::cout<<"Filtering matches:" << std::endl;
        for (const auto &m : matches)
            std::cout << m << std::endl;
    }


    std::vector<match_band> mbo;
    auto node = std::abs(matches[0].node);
    for (const auto &m : matches ){
        mbo.emplace_back(node == m.node, m.qStart-m.nStart, m.qEnd-m.nEnd, m.nEnd-m.nStart, m.score);
    }

    for (auto &m : mbo) {
        auto mino=std::min(m.min_offset,m.max_offset)-OFFSET_BANDWITDH;
        auto maxo=std::max(m.min_offset, m.max_offset)+OFFSET_BANDWITDH;
        m.min_offset = mino;
        m.max_offset = maxo;
    }

    if (verbose){
        std::cout << "Orientations, offsets, lengths and scores:" << std::endl;
        for (const auto &m : mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    auto prev_len = mbo.size()+1;

    while (mbo.size() < prev_len) {
        auto used = std::vector<bool>(mbo.size(), false);
        std::vector<match_band> new_mbo;

        for (int mi=0; mi < mbo.size(); mi++) {
            if (used[mi]){continue;}
            used[mi] = true;
            auto m = mbo[mi];
            for (int mi2 = 0; mi2 < mbo.size(); mi2++) {
                if (used[mi2]){continue;}
                auto m2 = mbo[mi2];
                if (m.min_offset<m2.max_offset and m2.min_offset < m.max_offset){
                    m.min_offset = std::min(m.min_offset,m2.min_offset);
                    m.max_offset = std::max(m.max_offset,m2.max_offset);
                    m.len += m2.len;
                    m.score += m2.score;
                    used[mi2] = true;
                }
            }
            new_mbo.emplace_back(m);
        }
        prev_len = mbo.size();
        mbo = new_mbo;
    }

    std::sort(mbo.begin(), mbo.end(), [](match_band &ma, match_band &mb){return ma.score > mb.score;});

    if (verbose){
        std::cout << "Consolidated orientations, offsets, lengths and scores:\n";
        for (const auto &m : mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    std::vector<match_band> filtered_mbo;
    auto max_score = mbo[0].score;
    std::copy_if(mbo.begin(), mbo.end(), std::back_inserter(filtered_mbo), [max_score](match_band &m){ return m.score >= 0.5f*max_score; });

    if (verbose){
        std::cout << "Filtered orientations, offsets, lengths and scores:\n";
        for (const auto &m : filtered_mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    // Create matches min, max positions for each band that has passed the filter
    std::vector<LongReadMapping> filtered_matches;

    for (const auto &mb : filtered_mbo) {
        LongReadMapping chained;
        chained.nStart=INT32_MAX;
        chained.nEnd=INT32_MIN;
        chained.score=0;
        chained.read_id=matches[0].read_id;
        chained.node=mb.dir ? std::abs(matches[0].node) : -std::abs(matches[0].node);
        for (const auto &m : matches) {
            if ((m.qStart - m.nStart) >= mb.min_offset and (m.qEnd - m.nEnd) <= mb.max_offset) {
                if (chained.nStart>m.nStart){
                    chained.nStart=m.nStart;
                    chained.qStart=m.qStart;
                }
                if (chained.nEnd<m.nEnd){
                    chained.nEnd=m.nEnd;
                    chained.qEnd=m.qEnd;
                }
                chained.score+=m.score;
            }
        }
        filtered_matches.emplace_back(chained);
    }

    if (verbose){
        std::cout<<"Filtered matches:" << std::endl;
        for (const auto &m : filtered_matches)
            std::cout << m << std::endl;
    }

    return filtered_matches;
}